

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metadata.cpp
# Opt level: O3

ContainerMetadata
duckdb::roaring::ContainerMetadata::CreateMetadata
          (uint16_t count,uint16_t array_null,uint16_t array_non_null,uint16_t runs)

{
  ushort uVar1;
  uint uVar2;
  uint uVar3;
  undefined6 in_register_00000012;
  undefined2 in_register_00000032;
  uint uVar4;
  ushort uVar5;
  ushort uVar6;
  
  uVar2 = (uint)count;
  uVar3 = (uint)CONCAT62(in_register_00000012,array_non_null);
  uVar4 = 0x102;
  if ((uVar3 < 0xf8 || CONCAT22(in_register_00000032,array_null) < 0xf8) || runs < 0x7c) {
    uVar1 = array_null + 8;
    if (array_null < 8) {
      uVar1 = array_null * 2;
    }
    uVar5 = array_non_null + 8;
    if (array_non_null < 8) {
      uVar5 = array_non_null * 2;
    }
    if (uVar1 < uVar5) {
      uVar5 = uVar1;
    }
    uVar1 = runs * 2 + 8;
    if (runs < 4) {
      uVar1 = runs * 4;
    }
    uVar6 = uVar1;
    if (uVar5 < uVar1) {
      uVar6 = uVar5;
    }
    if (uVar6 <= ((ushort)(uVar2 + 0x3f >> 3) & 0x1ff8)) {
      uVar4 = 0x100;
      uVar2 = (uint)runs;
      if (uVar5 <= uVar1) {
        uVar2 = uVar3;
        if (array_null < array_non_null) {
          uVar2 = CONCAT22(in_register_00000032,array_null);
        }
        uVar4 = (uint)(array_null <= array_non_null) * 0x100 + 1;
      }
    }
  }
  return (ContainerMetadata)(uVar2 << 0x10 | uVar4);
}

Assistant:

ContainerMetadata ContainerMetadata::CreateMetadata(uint16_t count, uint16_t array_null, uint16_t array_non_null,
                                                    uint16_t runs) {
	const bool can_use_null_array = array_null < MAX_ARRAY_IDX;
	const bool can_use_non_null_array = array_non_null < MAX_ARRAY_IDX;

	const bool can_use_run = runs < MAX_RUN_IDX;

	const bool can_use_array = can_use_null_array || can_use_non_null_array;
	if (!can_use_array && !can_use_run) {
		// Can not efficiently encode at all, write it as bitset
		return ContainerMetadata::BitsetContainer(count);
	}
	uint16_t null_array_cost = array_null < COMPRESSED_ARRAY_THRESHOLD
	                               ? array_null * sizeof(uint16_t)
	                               : COMPRESSED_SEGMENT_COUNT + (array_null * sizeof(uint8_t));
	uint16_t non_null_array_cost = array_non_null < COMPRESSED_ARRAY_THRESHOLD
	                                   ? array_non_null * sizeof(uint16_t)
	                                   : COMPRESSED_SEGMENT_COUNT + (array_non_null * sizeof(uint8_t));

	uint16_t lowest_array_cost = MinValue<uint16_t>(null_array_cost, non_null_array_cost);
	uint16_t lowest_run_cost = runs < COMPRESSED_RUN_THRESHOLD ? runs * sizeof(uint32_t)
	                                                           : COMPRESSED_SEGMENT_COUNT + (runs * sizeof(uint16_t));
	uint16_t bitset_cost =
	    (AlignValue<uint16_t, ValidityMask::BITS_PER_VALUE>(count) / ValidityMask::BITS_PER_VALUE) * sizeof(validity_t);
	if (MinValue<uint16_t>(lowest_array_cost, lowest_run_cost) > bitset_cost) {
		// The amount of values is too small, better off using bitset
		// we can detect this at decompression because we know how many values are left
		return ContainerMetadata::BitsetContainer(count);
	}

	if (lowest_array_cost <= lowest_run_cost) {
		if (array_null <= array_non_null) {
			return ContainerMetadata::ArrayContainer(array_null, NULLS);
		} else {
			return ContainerMetadata::ArrayContainer(array_non_null, NON_NULLS);
		}
	} else {
		return ContainerMetadata::RunContainer(runs);
	}
}